

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged_Test
           *this)

{
  byte bVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_1d8;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> local_138;
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_138);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&gtest_ar_.message_,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,&gtest_ar_.message_,0);
  subject::Subject::~Subject((Subject *)&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->(&local_1d8);
  bVar1 = bidfx_public_api::price::pixie::SubscriptionSync::IsChangedEdition();
  local_161 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional(&local_1d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)local_160,
               (AssertionResult *)"subject_register.NextSubscriptionSync()->IsChangedEdition()",
               "true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2ad,message);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_after_RFQ_toggle_only_results_in_the_edition_being_unchanged)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    subject_register.NextSubscriptionSync();

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    EXPECT_FALSE(subject_register.NextSubscriptionSync()->IsChangedEdition());
}